

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void luaV_concat(lua_State *L,int total)

{
  StkId pTVar1;
  size_t __n;
  int iVar2;
  int iVar3;
  char *str;
  GCObject *pGVar4;
  bool bVar5;
  TString *x_;
  TValue *io;
  size_t l_1;
  size_t l;
  int i;
  char *buffer;
  size_t tl;
  TValue *io1;
  TValue *io2;
  int n;
  StkId top;
  int total_local;
  lua_State *L_local;
  
  top._4_4_ = total;
  do {
    pTVar1 = L->top;
    io2._4_4_ = 2;
    if ((((pTVar1[-2].tt_ & 0xfU) == 4) || (pTVar1[-2].tt_ == 3)) &&
       (((pTVar1[-1].tt_ & 0xfU) == 4 || (iVar2 = luaV_tostring(L,pTVar1 + -1), iVar2 != 0)))) {
      if (*(long *)(pTVar1[-1].value_.f + 0x10) == 0) {
        if ((pTVar1[-2].tt_ & 0xfU) != 4) {
          luaV_tostring(L,pTVar1 + -2);
        }
      }
      else if (((pTVar1[-2].tt_ & 0xfU) == 4) && (*(long *)(pTVar1[-2].value_.f + 0x10) == 0)) {
        pTVar1[-2].value_ = pTVar1[-1].value_;
        pTVar1[-2].tt_ = pTVar1[-1].tt_;
      }
      else {
        buffer = *(char **)(pTVar1[-1].value_.f + 0x10);
        l._4_4_ = 1;
        while( true ) {
          iVar2 = l._4_4_;
          bVar5 = false;
          if ((l._4_4_ < top._4_4_) && (bVar5 = true, (pTVar1[-1 - (long)l._4_4_].tt_ & 0xfU) != 4))
          {
            iVar3 = luaV_tostring(L,pTVar1 + (-1 - (long)l._4_4_));
            bVar5 = iVar3 != 0;
          }
          if (!bVar5) break;
          if (-(long)buffer - 3U <= *(ulong *)(pTVar1[-1 - (long)l._4_4_].value_.f + 0x10)) {
            luaG_runerror(L,"string length overflow");
          }
          buffer = buffer + *(ulong *)(pTVar1[-1 - (long)l._4_4_].value_.f + 0x10);
          l._4_4_ = l._4_4_ + 1;
        }
        str = luaZ_openspace(L,&L->l_G->buff,(size_t)buffer);
        buffer = (char *)0x0;
        io2._4_4_ = l._4_4_;
        do {
          __n = *(size_t *)(pTVar1[-(long)l._4_4_].value_.f + 0x10);
          memcpy(str + (long)buffer,pTVar1[-(long)l._4_4_].value_.f + 0x18,__n);
          buffer = buffer + __n;
          l._4_4_ = l._4_4_ + -1;
        } while (0 < l._4_4_);
        pGVar4 = (GCObject *)luaS_newlstr(L,str,(size_t)buffer);
        pTVar1[-(long)iVar2].value_.gc = pGVar4;
        pTVar1[-(long)iVar2].tt_ = (pGVar4->gch).tt | 0x40;
      }
    }
    else {
      iVar2 = call_binTM(L,pTVar1 + -2,pTVar1 + -1,pTVar1 + -2,TM_CONCAT);
      if (iVar2 == 0) {
        luaG_concaterror(L,pTVar1 + -2,pTVar1 + -1);
      }
    }
    top._4_4_ = top._4_4_ - (io2._4_4_ + -1);
    L->top = L->top + -(long)(io2._4_4_ + -1);
  } while (1 < top._4_4_);
  return;
}

Assistant:

void luaV_concat (lua_State *L, int total) {
  lua_assert(total >= 2);
  do {
    StkId top = L->top;
    int n = 2;  /* number of elements handled in this pass (at least 2) */
    if (!(ttisstring(top-2) || ttisnumber(top-2)) || !tostring(L, top-1)) {
      if (!call_binTM(L, top-2, top-1, top-2, TM_CONCAT))
        luaG_concaterror(L, top-2, top-1);
    }
    else if (tsvalue(top-1)->len == 0)  /* second operand is empty? */
      (void)tostring(L, top - 2);  /* result is first operand */
    else if (ttisstring(top-2) && tsvalue(top-2)->len == 0) {
      setobjs2s(L, top - 2, top - 1);  /* result is second op. */
    }
    else {
      /* at least two non-empty string values; get as many as possible */
      size_t tl = tsvalue(top-1)->len;
      char *buffer;
      int i;
      /* collect total length */
      for (i = 1; i < total && tostring(L, top-i-1); i++) {
        size_t l = tsvalue(top-i-1)->len;
        if (l >= (MAX_SIZET/sizeof(char)) - tl)
          luaG_runerror(L, "string length overflow");
        tl += l;
      }
      buffer = luaZ_openspace(L, &G(L)->buff, tl);
      tl = 0;
      n = i;
      do {  /* concat all strings */
        size_t l = tsvalue(top-i)->len;
        memcpy(buffer+tl, svalue(top-i), l * sizeof(char));
        tl += l;
      } while (--i > 0);
      setsvalue2s(L, top-n, luaS_newlstr(L, buffer, tl));
    }
    total -= n-1;  /* got 'n' strings to create 1 new */
    L->top -= n-1;  /* popped 'n' strings and pushed one */
  } while (total > 1);  /* repeat until only 1 result left */
}